

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorldCoordinates.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::WorldCoordinates::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,WorldCoordinates *this)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  WorldCoordinates *local_18;
  WorldCoordinates *this_local;
  
  local_18 = this;
  this_local = (WorldCoordinates *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"X: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(double)this->m_f64X);
  poVar1 = std::operator<<(poVar1,",  Y: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(double)this->m_f64Y);
  poVar1 = std::operator<<(poVar1,",  Z: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(double)this->m_f64Z);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString WorldCoordinates::GetAsString() const
{
    KStringStream ss;

    ss << "X: "    << m_f64X
       << ",  Y: " << m_f64Y
       << ",  Z: " << m_f64Z << "\n";

    return ss.str();
}